

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void check_msacsr_cause(CPUMIPSState_conflict10 *env,uintptr_t retaddr)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (env->active_tc).msacsr;
  uVar2 = uVar1 >> 7 & 0x1f | 0x20;
  if ((uVar2 & uVar1 >> 0xc) == 0) {
    (env->active_tc).msacsr = (uVar1 >> 0xc & 0x1f) << 2 | uVar1;
    return;
  }
  do_raise_exception(env,(uint32_t)retaddr,(ulong)uVar2);
}

Assistant:

static inline void check_msacsr_cause(CPUMIPSState *env, uintptr_t retaddr)
{
    if ((GET_FP_CAUSE(env->active_tc.msacsr) &
            (GET_FP_ENABLE(env->active_tc.msacsr) | FP_UNIMPLEMENTED)) == 0) {
        UPDATE_FP_FLAGS(env->active_tc.msacsr,
                GET_FP_CAUSE(env->active_tc.msacsr));
    } else {
        do_raise_exception(env, EXCP_MSAFPE, retaddr);
    }
}